

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeventdispatcher_glib.cpp
# Opt level: O3

gboolean idleTimerSourcePrepare(GSource *source,gint *timeout)

{
  gpointer pvVar1;
  uint uVar2;
  long lVar3;
  gint gVar4;
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> _Var5;
  long lVar7;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> oVar8;
  long lVar6;
  
  pvVar1 = source[1].callback_data;
  if (*(char *)((long)pvVar1 + 0x8c) == '\0') {
    if (timeout != (gint *)0x0) {
      *timeout = -1;
    }
    return 0;
  }
  if ((*(byte *)((long)pvVar1 + 0x88) & 8) == 0) {
    oVar8 = QTimerInfoList::timerWait((QTimerInfoList *)((long)pvVar1 + 0x60));
    _Var5 = (_Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true>)
            0xfffffffffff0bdc0;
    if (((undefined1  [16])
         oVar8.
         super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
         ._M_payload.
         super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> &
        (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      _Var5 = oVar8.
              super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ._M_payload;
    }
    lVar7 = (ulong)(((long)_Var5 / 1000000) * 1000000 < (long)_Var5) + (long)_Var5 / 1000000;
    lVar3 = 0x7fffffff;
    if (lVar7 < 0x7fffffff) {
      lVar3 = lVar7;
    }
    lVar6 = -0x80000000;
    if (-0x80000000 < lVar3) {
      lVar6 = lVar3;
    }
    gVar4 = (gint)lVar6;
    uVar2 = (uint)(lVar7 == 0);
  }
  else {
    uVar2 = 1;
    gVar4 = -1;
  }
  *timeout = gVar4;
  return uVar2;
}

Assistant:

static gboolean idleTimerSourcePrepare(GSource *source, gint *timeout)
{
    GIdleTimerSource *idleTimerSource = reinterpret_cast<GIdleTimerSource *>(source);
    GTimerSource *timerSource = idleTimerSource->timerSource;
    if (!timerSource->runWithIdlePriority) {
        // Yield to the normal priority timer source
        if (timeout)
            *timeout = -1;
        return false;
    }

    return timerSourcePrepareHelper(timerSource, timeout);
}